

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

mapped_type * __thiscall
wasm::
getModuleElement<std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>>
          (wasm *this,
          unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
          *m,Name name,string *funcName)

{
  ostream *poVar1;
  iterator iVar2;
  Fatal *this_00;
  undefined1 local_1b0 [392];
  undefined1 local_28 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_len;
  local_28 = (undefined1  [8])m;
  iVar2 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Export_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Export_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,(key_type *)local_28);
  if (iVar2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Export_*>,_true>._M_cur !=
      (__node_type *)0x0) {
    return (mapped_type *)
           ((long)iVar2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Export_*>,_true>
                  ._M_cur + 0x18);
  }
  Fatal::Fatal((Fatal *)local_1b0);
  poVar1 = (ostream *)(local_1b0 + 0x10);
  std::operator<<(poVar1,"Module::");
  std::operator<<(poVar1,name.super_IString.str._M_str);
  std::operator<<(poVar1,": ");
  this_00 = Fatal::operator<<((Fatal *)local_1b0,(Name *)local_28);
  Fatal::operator<<(this_00,(char (*) [16])" does not exist");
  Fatal::~Fatal((Fatal *)local_1b0);
}

Assistant:

typename Map::mapped_type&
getModuleElement(Map& m, Name name, const std::string& funcName) {
  auto iter = m.find(name);
  if (iter == m.end()) {
    Fatal() << "Module::" << funcName << ": " << name << " does not exist";
  }
  return iter->second;
}